

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_CLOCK_INFO_Unmarshal(TPMS_CLOCK_INFO *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT32 UVar2;
  TPM_RC TVar3;
  UINT64 UVar4;
  
  iVar1 = *size;
  *size = iVar1 + -8;
  TVar3 = 0x9a;
  if (7 < iVar1) {
    UVar4 = ByteArrayToUint64(*buffer);
    target->clock = UVar4;
    *buffer = *buffer + 8;
    iVar1 = *size;
    *size = iVar1 + -4;
    TVar3 = 0x9a;
    if (3 < iVar1) {
      UVar2 = ByteArrayToUint32(*buffer);
      target->resetCount = UVar2;
      *buffer = *buffer + 4;
      iVar1 = *size;
      *size = iVar1 + -4;
      TVar3 = 0x9a;
      if (3 < iVar1) {
        UVar2 = ByteArrayToUint32(*buffer);
        target->restartCount = UVar2;
        *buffer = *buffer + 4;
        TVar3 = UINT8_Unmarshal(&target->safe,buffer,size);
        if ((TVar3 == 0) && (TVar3 = 0x84, target->safe < 2)) {
          TVar3 = 0;
        }
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMS_CLOCK_INFO_Unmarshal(TPMS_CLOCK_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT64_Unmarshal((UINT64 *)&(target->clock), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT32_Unmarshal((UINT32 *)&(target->resetCount), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT32_Unmarshal((UINT32 *)&(target->restartCount), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_YES_NO_Unmarshal((TPMI_YES_NO *)&(target->safe), buffer, size);
    return result;
}